

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O3

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetContact(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 *puVar3;
  self_type *psVar4;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  Ptr PVar6;
  path_type local_80;
  type local_50;
  
  puVar3 = (undefined8 *)operator_new(0xb0);
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_002a55e0;
  memset(puVar3 + 4,0,0x90);
  puVar3[2] = puVar3 + 4;
  puVar3[3] = 0;
  puVar3[6] = puVar3 + 8;
  puVar3[10] = puVar3 + 0xc;
  puVar3[0xe] = puVar3 + 0x10;
  puVar3[0x12] = puVar3 + 0x14;
  *(undefined8 **)(this + 8) = puVar3;
  *(string **)this = (string *)(puVar3 + 2);
  paVar1 = &local_80.m_value.field_2;
  local_80.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"phone_number","");
  local_80.m_separator = '.';
  local_80.m_start._M_current = local_80.m_value._M_dataplus._M_p;
  psVar4 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_80);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (&local_50,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)psVar4);
  std::__cxx11::string::operator=((string *)(puVar3 + 2),(string *)&local_50);
  paVar2 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_value._M_dataplus._M_p);
  }
  local_80.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"first_name","");
  local_80.m_separator = '.';
  local_80.m_start._M_current = local_80.m_value._M_dataplus._M_p;
  psVar4 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_80);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (&local_50,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)psVar4);
  std::__cxx11::string::operator=((string *)(puVar3 + 6),(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_value._M_dataplus._M_p);
  }
  local_80.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"last_name","");
  local_80.m_separator = '.';
  local_80.m_start._M_current = local_80.m_value._M_dataplus._M_p;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_50,in_RDX,&local_80,"");
  std::__cxx11::string::operator=((string *)(puVar3 + 10),(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_value._M_dataplus._M_p);
  }
  local_80.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"user_id","");
  local_80.m_separator = '.';
  local_80.m_start._M_current = local_80.m_value._M_dataplus._M_p;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_50,in_RDX,&local_80,"");
  std::__cxx11::string::operator=((string *)(puVar3 + 0xe),(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_value._M_dataplus._M_p);
  }
  local_80.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"vcard","");
  local_80.m_separator = '.';
  local_80.m_start._M_current = local_80.m_value._M_dataplus._M_p;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_50,in_RDX,&local_80,"");
  std::__cxx11::string::operator=((string *)(puVar3 + 0x12),(string *)&local_50);
  _Var5._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
    _Var5._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_value._M_dataplus._M_p);
    _Var5._M_pi = extraout_RDX_01;
  }
  PVar6.super___shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  PVar6.super___shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Ptr)PVar6.super___shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Contact::Ptr TgTypeParser::parseJsonAndGetContact(const ptree& data) const {
    auto result(make_shared<Contact>());
    result->phoneNumber = data.get<string>("phone_number");
    result->firstName = data.get<string>("first_name");
    result->lastName = data.get("last_name", "");
    result->userId = data.get("user_id", "");
    result->vcard = data.get("vcard", "");
    return result;
}